

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangw.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  __u8 _Var2;
  byte bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  byte bVar9;
  long lVar10;
  uint uVar11;
  undefined8 uVar12;
  char *pcVar13;
  long lVar14;
  uchar *puVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  __u8 limit_hops;
  int local_2b48;
  uint local_2b44;
  int local_2b40;
  cgw_csum_xor cs_xor;
  uint dst_ifindex;
  uint src_ifindex;
  __u32 uid;
  int local_2b20;
  can_filter filter;
  canid_t local_2af8 [6];
  sockaddr_nl nladdr;
  cgw_csum_crc8 cs_crc8;
  modattr modmsg [4];
  anon_struct_1520_3_441c1061 req;
  char crc8tab [513];
  fdmodattr fdmodmsg [4];
  uchar rxbuf [8192];
  
  src_ifindex = 0;
  dst_ifindex = 0;
  limit_hops = '\0';
  cs_xor.from_idx = '\0';
  cs_xor.to_idx = '\0';
  cs_xor.result_idx = '\0';
  cs_xor.init_xor_val = '\0';
  memset(&cs_crc8,0,0x11a);
  memset(crc8tab,0,0x201);
  memset(&req,0,0x5f0);
  bVar1 = false;
  bVar16 = false;
  iVar5 = 0;
  local_2b20 = 0;
  local_2b48 = 0;
  uVar11 = 0;
  local_2b40 = argc;
LAB_00101899:
  do {
    iVar4 = getopt(argc,argv,"ADFLs:d:Xteiu:l:f:c:p:x:m:M:?");
    pcVar13 = _optarg;
    if (0x62 < iVar4) {
      switch(iVar4) {
      case 99:
        iVar4 = __isoc99_sscanf(_optarg,"%hhd:%hhd:%hhd:%hhx:%hhx:%512s",&cs_crc8,&cs_crc8.to_idx,
                                &cs_crc8.result_idx,&cs_crc8.init_crc_val,&cs_crc8.final_xor_val,
                                crc8tab);
        if ((iVar4 == 6) && (sVar7 = strlen(crc8tab), sVar7 == 0x200)) {
          pcVar13 = crc8tab;
          lVar10 = 0;
          do {
            iVar4 = __isoc99_sscanf(pcVar13,"%2hhx",cs_crc8.crctab + lVar10);
            if (iVar4 == 0) break;
            pcVar13 = pcVar13 + 2;
            bVar16 = lVar10 != 0xff;
            lVar10 = lVar10 + 1;
          } while (bVar16);
          bVar16 = true;
          argc = local_2b40;
          if (iVar4 != 0) goto LAB_00101899;
        }
        pcVar13 = "Bad CRC8 checksum definition \'%s\'.\n";
        goto LAB_00102922;
      case 100:
        dst_ifindex = if_nametoindex(_optarg);
        if (dst_ifindex != 0) goto LAB_00101899;
        main_cold_1();
        break;
      case 0x65:
        uVar11 = uVar11 | 1;
        goto LAB_00101899;
      case 0x66:
        iVar4 = __isoc99_sscanf(_optarg,"%x:%x",&filter,&filter.can_mask);
        if (iVar4 != 2) {
          iVar4 = __isoc99_sscanf(_optarg,"%x~%x",&filter,&filter.can_mask);
          if (iVar4 != 2) goto LAB_00102911;
          filter.can_id._3_1_ = filter.can_id._3_1_ | 0x20;
        }
        goto LAB_00101899;
      default:
        goto switchD_001018cd_caseD_67;
      case 0x69:
        uVar11 = uVar11 | 4;
        goto LAB_00101899;
      case 0x6c:
        iVar4 = __isoc99_sscanf(_optarg,"%hhu",&limit_hops);
        if ((iVar4 == 1) && (limit_hops != '\0')) goto LAB_00101899;
        break;
      case 0x6d:
        if (local_2b20 < 4) {
          rxbuf[0] = '\0';
          rxbuf[1] = '\0';
          rxbuf[2] = '\0';
          rxbuf[3] = '\0';
          rxbuf[4] = '\0';
          rxbuf[5] = '\0';
          rxbuf[6] = '\0';
          rxbuf[7] = '\0';
          rxbuf[8] = '\0';
          rxbuf[9] = '\0';
          rxbuf[10] = '\0';
          rxbuf[0xb] = '\0';
          rxbuf[0xc] = '\0';
          rxbuf[0xd] = '\0';
          rxbuf[0xe] = '\0';
          rxbuf[0xf] = '\0';
          rxbuf[0x10] = '\0';
          pcVar6 = strchr(_optarg,0x3a);
          if ((long)pcVar6 - (long)pcVar13 < 4 && pcVar6 != pcVar13) {
            local_2b44 = uVar11;
            iVar4 = strncmp(pcVar13,"AND",3);
            if (iVar4 == 0) {
              _Var2 = '\x01';
            }
            else {
              iVar4 = strncmp(pcVar13,"OR",2);
              if (iVar4 == 0) {
                _Var2 = '\x02';
              }
              else {
                iVar4 = strncmp(pcVar13,"XOR",3);
                if (iVar4 == 0) {
                  _Var2 = '\x03';
                }
                else {
                  iVar4 = strncmp(pcVar13,"SET",3);
                  if (iVar4 != 0) {
                    uVar12 = 2;
                    goto LAB_00102044;
                  }
                  _Var2 = '\x04';
                }
              }
            }
            lVar10 = (long)local_2b20;
            modmsg[lVar10].instruction = _Var2;
            pcVar13 = pcVar6 + 1;
            pcVar8 = strchr(pcVar13,0x3a);
            if ((long)pcVar8 - (long)pcVar13 < 4 && pcVar8 != pcVar13) {
              modmsg[lVar10].modtype = '\0';
              pcVar6 = pcVar6 + 2;
LAB_00101f8a:
              bVar3 = pcVar6[-1];
              if (0x48 < bVar3) {
                bVar9 = 1;
                if (bVar3 != 0x49) {
                  if (bVar3 != 0x4c) goto LAB_00102038;
                  bVar9 = 2;
                }
LAB_00101faf:
                modmsg[lVar10].modtype = modmsg[lVar10].modtype | bVar9;
                pcVar6 = pcVar6 + 1;
                goto LAB_00101f8a;
              }
              if (bVar3 == 0x44) {
                bVar9 = 4;
                goto LAB_00101faf;
              }
              if (bVar3 == 0x3a) {
                bVar17 = false;
                iVar4 = __isoc99_sscanf(pcVar6,"%x.%hhx.%16s",local_2af8,&modmsg[lVar10].cf.field_1,
                                        rxbuf);
                uVar12 = 5;
                if (iVar4 != 3) goto LAB_00102047;
                modmsg[lVar10].cf.can_id = local_2af8[0];
                puVar15 = rxbuf;
                sVar7 = strlen((char *)puVar15);
                if (sVar7 == 0x10) {
                  lVar14 = 0;
                  goto LAB_0010200e;
                }
                uVar12 = 6;
                goto LAB_00102044;
              }
LAB_00102038:
              uVar12 = 4;
            }
            else {
              uVar12 = 3;
            }
          }
          else {
            uVar12 = 1;
            local_2b44 = uVar11;
          }
LAB_00102044:
          bVar17 = false;
          goto LAB_00102047;
        }
        goto LAB_00101899;
      case 0x70:
        iVar4 = __isoc99_sscanf(_optarg,"%hhu:",&cs_crc8.profile);
        if (iVar4 == 1) {
          if (cs_crc8.profile == '\x03') goto LAB_00101899;
          if (cs_crc8.profile == '\x02') {
            pcVar13 = strchr(pcVar13,0x3a);
            if ((pcVar13 != (char *)0x0) && (sVar7 = strlen(pcVar13), sVar7 == 0x21)) {
              pcVar13 = pcVar13 + 1;
              lVar10 = 0;
              do {
                iVar4 = __isoc99_sscanf(pcVar13,"%2hhx",cs_crc8.profile_data + lVar10);
                bVar17 = iVar4 == 0;
                if (bVar17) break;
                pcVar13 = pcVar13 + 2;
                bVar18 = lVar10 != 0xf;
                lVar10 = lVar10 + 1;
              } while (bVar18);
              goto LAB_00101cfd;
            }
          }
          else if (cs_crc8.profile == '\x01') {
            iVar4 = __isoc99_sscanf(pcVar13,"%hhu:%2hhx",&cs_crc8.profile,cs_crc8.profile_data);
            bVar17 = iVar4 != 2;
LAB_00101cfd:
            argc = local_2b40;
            if (!bVar17) goto LAB_00101899;
          }
        }
        pcVar13 = "Bad CRC8 profile definition \'%s\'.\n";
        goto LAB_00102922;
      case 0x73:
        src_ifindex = if_nametoindex(_optarg);
        if (src_ifindex == 0) {
          main_cold_2();
          goto LAB_001028da;
        }
        goto LAB_00101899;
      case 0x74:
        uVar11 = uVar11 | 2;
        goto LAB_00101899;
      case 0x75:
        strtoul(_optarg,(char **)0x0,0x10);
        goto LAB_00101899;
      case 0x78:
        goto switchD_001018cd_caseD_78;
      }
      pcVar13 = "Bad hop limit definition \'%s\'.\n";
      goto LAB_00102922;
    }
    switch(iVar4) {
    case 0x3f:
      pcVar13 = __xpg_basename(*argv);
      print_usage(pcVar13);
      exit(0);
    case 0x41:
      iVar5 = iVar5 + (uint)(iVar5 == 0);
      break;
    case 0x44:
      if (iVar5 == 0) {
        iVar5 = 2;
      }
      break;
    case 0x46:
      if (iVar5 == 0) {
        iVar5 = 3;
      }
      break;
    case 0x4c:
      if (iVar5 == 0) {
        iVar5 = 4;
      }
      break;
    case 0x4d:
      if (local_2b48 < 4) {
        bVar17 = false;
        memset(rxbuf,0,0x81);
        pcVar6 = strchr(pcVar13,0x3a);
        if ((long)pcVar6 - (long)pcVar13 < 4 && pcVar6 != pcVar13) {
          local_2b44 = uVar11;
          iVar4 = strncmp(pcVar13,"AND",3);
          if (iVar4 == 0) {
            _Var2 = '\x0f';
LAB_00101e1b:
            lVar10 = (long)local_2b48;
            fdmodmsg[lVar10].instruction = _Var2;
            pcVar13 = pcVar6 + 1;
            pcVar8 = strchr(pcVar13,0x3a);
            if ((long)pcVar8 - (long)pcVar13 < 5 && pcVar8 != pcVar13) {
              fdmodmsg[lVar10].modtype = '\0';
              pcVar6 = pcVar6 + 2;
              do {
                switch(pcVar6[-1]) {
                case 'D':
                  bVar3 = 4;
                  break;
                case 'E':
                case 'G':
                case 'H':
                case 'J':
                case 'K':
                  goto switchD_00101e81_caseD_45;
                case 'F':
                  bVar3 = 8;
                  break;
                case 'I':
                  bVar3 = 1;
                  break;
                case 'L':
                  bVar3 = 2;
                  break;
                default:
                  if (pcVar6[-1] == ':') {
                    bVar17 = false;
                    iVar4 = __isoc99_sscanf(pcVar6,"%x.%hhx.%hhx.%128s",local_2af8,
                                            &fdmodmsg[lVar10].cf.flags,&fdmodmsg[lVar10].cf.len,
                                            rxbuf);
                    uVar12 = 5;
                    if (iVar4 != 4) goto LAB_00101f34;
                    fdmodmsg[lVar10].cf.can_id = local_2af8[0];
                    puVar15 = rxbuf;
                    sVar7 = strlen((char *)puVar15);
                    if (sVar7 != 0x80) {
                      uVar12 = 6;
                      goto LAB_00101f31;
                    }
                    lVar14 = 0;
                    goto LAB_00101efe;
                  }
                  goto switchD_00101e81_caseD_45;
                }
                fdmodmsg[lVar10].modtype = fdmodmsg[lVar10].modtype | bVar3;
                pcVar6 = pcVar6 + 1;
              } while( true );
            }
            uVar12 = 3;
          }
          else {
            iVar4 = strncmp(pcVar13,"OR",2);
            if (iVar4 == 0) {
              _Var2 = '\x10';
              goto LAB_00101e1b;
            }
            iVar4 = strncmp(pcVar13,"XOR",3);
            if (iVar4 == 0) {
              _Var2 = '\x11';
              goto LAB_00101e1b;
            }
            iVar4 = strncmp(pcVar13,"SET",3);
            if (iVar4 == 0) {
              _Var2 = '\x12';
              goto LAB_00101e1b;
            }
            uVar12 = 2;
          }
          goto LAB_00101f31;
        }
        uVar12 = 1;
        local_2b44 = uVar11;
        goto LAB_00101f34;
      }
      break;
    default:
      if (iVar4 == 0x58) {
        uVar11 = uVar11 | 8;
        break;
      }
      if (iVar4 == -1) {
        if (((_optind == argc) && (iVar5 != 0)) &&
           ((1 < iVar5 - 1U || ((src_ifindex != 0 && (dst_ifindex != 0)))))) {
          if ((uVar11 & 8) == 0) {
            if (local_2b48 == 0) {
LAB_001020ed:
              if ((local_2b20 != 0 || local_2b48 != 0) || (!bVar16 && !bVar1)) {
                local_2b40 = socket(0x10,3,0);
                iVar5 = (*(code *)(&DAT_001030d8 + *(int *)(&DAT_001030d8 + (ulong)(iVar5 - 1U) * 4)
                                  ))();
                return iVar5;
              }
              pcVar13 = "-c or -x can only be used in conjunction with -m/-M";
            }
            else {
              pcVar13 = "No -M modifications allowed in Classic CAN mode!";
            }
          }
          else {
            if (local_2b20 == 0) goto LAB_001020ed;
            pcVar13 = "No -m modifications allowed in CAN FD mode!";
          }
          puts(pcVar13);
        }
        else {
          pcVar13 = __xpg_basename(*argv);
          print_usage(pcVar13);
        }
        goto LAB_00102929;
      }
    case 0x40:
    case 0x42:
    case 0x43:
    case 0x45:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
switchD_001018cd_caseD_67:
      main_cold_4();
LAB_00102911:
      pcVar13 = "Bad filter definition \'%s\'.\n";
      goto LAB_00102922;
    }
  } while( true );
  while( true ) {
    lVar14 = lVar14 + 1;
    puVar15 = puVar15 + 2;
    uVar12 = 0;
    if (lVar14 == 0x40) break;
LAB_00101efe:
    iVar4 = __isoc99_sscanf(puVar15,"%2hhx",fdmodmsg[lVar10].cf.data + lVar14);
    bVar17 = iVar4 != 0;
    if (iVar4 == 0) {
      uVar12 = 7;
      break;
    }
  }
  goto LAB_00101f34;
switchD_00101e81_caseD_45:
  uVar12 = 4;
LAB_00101f31:
  bVar17 = false;
LAB_00101f34:
  local_2b48 = local_2b48 + 1;
LAB_0010204b:
  uVar11 = local_2b44;
  if (!bVar17) {
    printf("Problem %d with modification definition \'%s\'.\n",uVar12,_optarg);
    goto LAB_00102929;
  }
  goto LAB_00101899;
switchD_001018cd_caseD_78:
  iVar4 = __isoc99_sscanf(_optarg,"%hhd:%hhd:%hhd:%hhx",&cs_xor,&cs_xor.to_idx,&cs_xor.result_idx,
                          &cs_xor.init_xor_val);
  bVar1 = true;
  if (iVar4 != 4) {
LAB_001028da:
    pcVar13 = "Bad XOR checksum definition \'%s\'.\n";
LAB_00102922:
    printf(pcVar13,_optarg);
LAB_00102929:
    exit(1);
  }
  goto LAB_00101899;
  while( true ) {
    lVar14 = lVar14 + 1;
    puVar15 = puVar15 + 2;
    uVar12 = 0;
    if (lVar14 == 8) break;
LAB_0010200e:
    iVar4 = __isoc99_sscanf(puVar15,"%2hhx",modmsg[lVar10].cf.data + lVar14);
    bVar17 = iVar4 != 0;
    if (iVar4 == 0) {
      uVar12 = 7;
      break;
    }
  }
LAB_00102047:
  local_2b20 = local_2b20 + 1;
  goto LAB_0010204b;
}

Assistant:

int main(int argc, char **argv)
{
	int s;
	int err = 0;

	int opt;
	extern int optind, opterr, optopt;

	int cmd = UNSPEC;
	int have_filter = 0;
	int have_cs_xor = 0;
	int have_cs_crc8 = 0;

	struct {
		struct nlmsghdr nh;
		struct rtcanmsg rtcan;
		char buf[1500];
	} req;

	unsigned char rxbuf[8192]; /* netlink receive buffer */
	struct nlmsghdr *nlh;
	struct nlmsgerr *rte;
	unsigned int src_ifindex = 0;
	unsigned int dst_ifindex = 0;
	__u32 uid = 0;
	__u8 limit_hops = 0;
	__u16 flags = 0;
	int len;

	struct can_filter filter;
	struct sockaddr_nl nladdr;

	struct cgw_csum_xor cs_xor = { 0 };
	struct cgw_csum_crc8 cs_crc8 = { 0 };
	char crc8tab[513] = {0};

	struct modattr modmsg[CGW_MOD_FUNCS];
	struct fdmodattr fdmodmsg[CGW_MOD_FUNCS];
	int modidx = 0;
	int fdmodidx = 0;
	int i;

	memset(&req, 0, sizeof(req));

	while ((opt = getopt(argc, argv, "ADFLs:d:Xteiu:l:f:c:p:x:m:M:?")) != -1) {
		switch (opt) {

		case 'A':
			if (cmd == UNSPEC)
				cmd = ADD;
			break;

		case 'D':
			if (cmd == UNSPEC)
				cmd = DEL;
			break;

		case 'F':
			if (cmd == UNSPEC)
				cmd = FLUSH;
			break;

		case 'L':
			if (cmd == UNSPEC)
				cmd = LIST;
			break;

		case 's':
			src_ifindex = if_nametoindex(optarg);
			if (!src_ifindex) {
				perror("src if_nametoindex");
				exit(1);
			}
			break;

		case 'd':
			dst_ifindex = if_nametoindex(optarg);
			if (!dst_ifindex) {
				perror("dst if_nametoindex");
				exit(1);
			}
			break;

		case 'X':
			flags |= CGW_FLAGS_CAN_FD;
			break;

		case 't':
			flags |= CGW_FLAGS_CAN_SRC_TSTAMP;
			break;

		case 'e':
			flags |= CGW_FLAGS_CAN_ECHO;
			break;

		case 'i':
			flags |= CGW_FLAGS_CAN_IIF_TX_OK;
			break;

		case 'u':
			uid = strtoul(optarg, NULL, 16);
			break;

		case 'l':
			if (sscanf(optarg, "%hhu", &limit_hops) != 1 || !(limit_hops)) {
				printf("Bad hop limit definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'f':
			if (sscanf(optarg, "%x:%x", &filter.can_id,
				   &filter.can_mask) == 2) {
				have_filter = 1;
			} else if (sscanf(optarg, "%x~%x", &filter.can_id,
					  &filter.can_mask) == 2) {
				filter.can_id |= CAN_INV_FILTER;
				have_filter = 1;
			} else {
				printf("Bad filter definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'x':
			if (sscanf(optarg, "%hhd:%hhd:%hhd:%hhx",
				   &cs_xor.from_idx, &cs_xor.to_idx,
				   &cs_xor.result_idx, &cs_xor.init_xor_val) == 4) {
				have_cs_xor = 1;
			} else {
				printf("Bad XOR checksum definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'c':
			if ((sscanf(optarg, "%hhd:%hhd:%hhd:%hhx:%hhx:%512s",
				    &cs_crc8.from_idx, &cs_crc8.to_idx,
				    &cs_crc8.result_idx, &cs_crc8.init_crc_val,
				    &cs_crc8.final_xor_val, crc8tab) == 6) &&
			    (strlen(crc8tab) == 512) &&
			    (b64hex(crc8tab, (unsigned char *)&cs_crc8.crctab, 256) == 0)) {
				have_cs_crc8 = 1;
			} else {
				printf("Bad CRC8 checksum definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'p':
			if (parse_crc8_profile(optarg, &cs_crc8)) {
				printf("Bad CRC8 profile definition '%s'.\n", optarg);
				exit(1);
			}
			break;

		case 'm':
			/* may be triggered by each of the CGW_MOD_FUNCS functions */
			if ((modidx < CGW_MOD_FUNCS) && (err = parse_mod(optarg, &modmsg[modidx++]))) {
				printf("Problem %d with modification definition '%s'.\n", err, optarg);
				exit(1);
			}
			break;

		case 'M':
			/* may be triggered by each of the CGW_FDMOD_FUNCS functions */
			if ((fdmodidx < CGW_MOD_FUNCS) && (err = parse_fdmod(optarg, &fdmodmsg[fdmodidx++]))) {
				printf("Problem %d with modification definition '%s'.\n", err, optarg);
				exit(1);
			}
			break;

		case '?':
			print_usage(basename(argv[0]));
			exit(0);
			break;

		default:
			fprintf(stderr, "Unknown option %c\n", opt);
			print_usage(basename(argv[0]));
			exit(1);
			break;
		}
	}

	if ((argc - optind != 0) || (cmd == UNSPEC)) {
		print_usage(basename(argv[0]));
		exit(1);
	}

	if ((cmd == ADD || cmd == DEL) &&
	    ((!src_ifindex) || (!dst_ifindex))) {
		print_usage(basename(argv[0]));
		exit(1);
	}

	if (flags & CGW_FLAGS_CAN_FD) {
		if (modidx) {
			printf("No -m modifications allowed in CAN FD mode!\n");
			exit(1);
		}
	} else {
		if (fdmodidx) {
			printf("No -M modifications allowed in Classic CAN mode!\n");
			exit(1);
		}
	}

	if ((!modidx && !fdmodidx) && (have_cs_crc8 || have_cs_xor)) {
		printf("-c or -x can only be used in conjunction with -m/-M\n");
		exit(1);
	}

	s = socket(PF_NETLINK, SOCK_RAW, NETLINK_ROUTE);

	switch (cmd) {

	case ADD:
		req.nh.nlmsg_flags = NLM_F_REQUEST | NLM_F_ACK;
		req.nh.nlmsg_type  = RTM_NEWROUTE;
		break;

	case DEL:
		req.nh.nlmsg_flags = NLM_F_REQUEST | NLM_F_ACK;
		req.nh.nlmsg_type  = RTM_DELROUTE;
		break;

	case FLUSH:
		req.nh.nlmsg_flags = NLM_F_REQUEST | NLM_F_ACK;
		req.nh.nlmsg_type  = RTM_DELROUTE;
		/* if_index set to 0 => remove all entries */
		src_ifindex  = 0;
		dst_ifindex  = 0;
		break;

	case LIST:
		req.nh.nlmsg_flags = NLM_F_REQUEST | NLM_F_DUMP;
		req.nh.nlmsg_type  = RTM_GETROUTE;
		break;

	default:
		printf("This function is not yet implemented.\n");
		exit(1);
		break;
	}

	req.nh.nlmsg_len   = NLMSG_LENGTH(sizeof(struct rtcanmsg));
	req.nh.nlmsg_seq   = 0;

	req.rtcan.can_family  = AF_CAN;
	req.rtcan.gwtype = CGW_TYPE_CAN_CAN;
	req.rtcan.flags = flags;

	addattr_l(&req.nh, sizeof(req), CGW_SRC_IF, &src_ifindex, sizeof(src_ifindex));
	addattr_l(&req.nh, sizeof(req), CGW_DST_IF, &dst_ifindex, sizeof(dst_ifindex));

	/* add new attributes here */

	if (have_filter)
		addattr_l(&req.nh, sizeof(req), CGW_FILTER, &filter, sizeof(filter));

	if (have_cs_crc8)
		addattr_l(&req.nh, sizeof(req), CGW_CS_CRC8, &cs_crc8, sizeof(cs_crc8));

	if (have_cs_xor)
		addattr_l(&req.nh, sizeof(req), CGW_CS_XOR, &cs_xor, sizeof(cs_xor));

	if (uid)
		addattr_l(&req.nh, sizeof(req), CGW_MOD_UID, &uid, sizeof(__u32));

	if (limit_hops)
		addattr_l(&req.nh, sizeof(req), CGW_LIM_HOPS, &limit_hops, sizeof(__u8));

	/*
	 * a better example code
	 * modmsg.modtype = CGW_MOD_ID;
	 * addattr_l(&req.n, sizeof(req), CGW_MOD_SET, &modmsg, CGW_MODATTR_LEN);
	 */

	/* add up to CGW_MOD_FUNCS modification definitions */
	for (i = 0; i < modidx; i++)
		addattr_l(&req.nh, sizeof(req), modmsg[i].instruction, &modmsg[i], CGW_MODATTR_LEN);

	/* add up to CGW_FDMOD_FUNCS modification definitions */
	for (i = 0; i < fdmodidx; i++)
		addattr_l(&req.nh, sizeof(req), fdmodmsg[i].instruction, &fdmodmsg[i], CGW_FDMODATTR_LEN);

	memset(&nladdr, 0, sizeof(nladdr));
	nladdr.nl_family = AF_NETLINK;
	nladdr.nl_pid    = 0;
	nladdr.nl_groups = 0;

	err = sendto(s, &req, req.nh.nlmsg_len, 0,
		     (struct sockaddr*)&nladdr, sizeof(nladdr));
	if (err < 0) {
		perror("netlink sendto");
		return err;
	}

	/* clean netlink receive buffer */
	memset(rxbuf, 0x0, sizeof(rxbuf));

	if (cmd != LIST) {

		/*
		 * cmd == ADD || cmd == DEL || cmd == FLUSH
		 *
		 * Parse the requested netlink acknowledge return values.
		 */

		err = recv(s, &rxbuf, sizeof(rxbuf), 0);
		if (err < 0) {
			perror("netlink recv");
			return err;
		}
		nlh = (struct nlmsghdr *)rxbuf;
		if (nlh->nlmsg_type != NLMSG_ERROR) {
			fprintf(stderr, "unexpected netlink answer of type %d\n", nlh->nlmsg_type);
			return -EINVAL;
		}
		rte = (struct nlmsgerr *)NLMSG_DATA(nlh);
		err = rte->error;
		if (err < 0)
			fprintf(stderr, "netlink error %d (%s)\n", err, strerror(abs(err)));

	} else {

		/* cmd == LIST */

		while (1) {
			len = recv(s, &rxbuf, sizeof(rxbuf), 0);
			if (len < 0) {
				perror("netlink recv");
				return len;
			}
#if 0
			printf("received msg len %d\n", len);

			for (i = 0; i < len; i++)
				printf("%02X ", rxbuf[i]);

			printf("\n");
#endif
			/* leave on errors or NLMSG_DONE */
			if (parse_rtlist(argv[0], rxbuf, len))
				break;
		}
	}

	close(s);

	return err;
}